

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

size_t al_fwrite16be(ALLEGRO_FILE *f,int16_t w)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t b;
  uint8_t b_1;
  undefined1 local_22;
  char local_21;
  
  f->ungetc_len = 0;
  sVar1 = (*f->vtable->fi_fwrite)(f,&local_22,1);
  sVar2 = 0;
  if (sVar1 == 1) {
    f->ungetc_len = 0;
    local_21 = (char)w;
    sVar1 = (*f->vtable->fi_fwrite)(f,&local_21,1);
    sVar2 = (ulong)(local_21 == (char)w && sVar1 == 1) + 1;
  }
  return sVar2;
}

Assistant:

size_t al_fwrite16be(ALLEGRO_FILE *f, int16_t w)
{
   uint8_t b1, b2;
   ASSERT(f);

   b1 = (w & 0xFF00) >> 8;
   b2 = w & 0x00FF;

   if (al_fputc(f, b1) == b1) {
      if (al_fputc(f, b2) == b2) {
         return 2;
      }
      return 1;
   }
   return 0;
}